

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O3

bool __thiscall
assembler::SessionPDU::append(SessionPDU *this,const_iterator begin,const_iterator end)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *b;
  SZ_com_t *param;
  bool bVar1;
  int iVar2;
  difference_type __offset;
  ulong uVar3;
  uint uVar4;
  pointer puVar5;
  uint uVar6;
  size_t outLen;
  PrimaryHeader local_48;
  
  b = &this->buf_;
  puVar5 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  if (uVar3 < 0x10) {
    uVar4 = 0x10 - (int)uVar3;
    uVar6 = (int)end._M_current - (int)begin._M_current;
    if (uVar4 < uVar6) {
      uVar6 = uVar4;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)b,puVar5 + uVar3,
               begin._M_current,begin._M_current + uVar6);
    if ((ulong)((long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x10) {
      return true;
    }
    lrit::getHeader<lrit::PrimaryHeader>(&local_48,b,0);
    (this->ph_).dataLength = local_48.dataLength;
    (this->ph_).headerType = local_48.headerType;
    (this->ph_).field_0x1 = local_48._1_1_;
    (this->ph_).headerLength = local_48.headerLength;
    (this->ph_).fileType = local_48.fileType;
    *(undefined3 *)&(this->ph_).field_0x5 = local_48._5_3_;
    (this->ph_).totalHeaderLength = local_48.totalHeaderLength;
    *(undefined4 *)&(this->ph_).field_0xc = local_48._12_4_;
    puVar5 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
    begin._M_current = begin._M_current + uVar6;
  }
  uVar6 = (this->ph_).totalHeaderLength;
  if (uVar3 < uVar6) {
    uVar6 = uVar6 - (int)uVar3;
    uVar4 = (int)end._M_current - (int)begin._M_current;
    if (uVar6 < uVar4) {
      uVar4 = uVar6;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)b,puVar5 + uVar3,
               begin._M_current,begin._M_current + uVar4);
    if ((ulong)((long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <
        (ulong)(this->ph_).totalHeaderLength) {
      return true;
    }
    bVar1 = completeHeader(this);
    begin._M_current = begin._M_current + uVar4;
    if (!bVar1) {
      return false;
    }
  }
  param = (this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
          _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
          super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl;
  if (param == (SZ_com_t *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)b,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,begin._M_current,end._M_current);
    return true;
  }
  puVar5 = (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48._0_8_ =
       (long)(this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  if (begin._M_current != end._M_current) {
    iVar2 = SZ_BufftoBuffDecompress
                      (puVar5,(size_t *)&local_48,begin._M_current,
                       (long)end._M_current - (long)begin._M_current,param);
    if (iVar2 != 0) {
      return false;
    }
    puVar5 = (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)b,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,puVar5,puVar5 + local_48._0_8_);
    this->linesDone_ = this->linesDone_ + 1;
    return true;
  }
  return true;
}

Assistant:

bool SessionPDU::append(
    std::vector<uint8_t>::const_iterator begin,
    std::vector<uint8_t>::const_iterator end) {
  // Copy primary header first so we can determine total header length
  if (buf_.size() < 16) {
    size_t len = std::min(
      uint32_t(16 - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (buf_.size() < 16) {
      return true;
    }
    ph_ = lrit::getHeader<lrit::PrimaryHeader>(buf_, 0);
  }

  // Copy secondary headers verbatim
  if (ph_.totalHeaderLength > buf_.size()) {
    size_t len = std::min(
      uint32_t(ph_.totalHeaderLength - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (ph_.totalHeaderLength > buf_.size()) {
      return true;
    }
    if (!completeHeader()) {
      return false;
    }
  }

  // Copy data verbatim if decompression parameters not set
  if (!szParam_) {
    buf_.insert(buf_.end(), begin, end);
    return true;
  }

  // Decompress otherwise
  uint8_t* out = szTmp_.data();
  size_t outLen = szTmp_.size();
  const uint8_t* dataIn = &(*begin);
  size_t dataInLen = end - begin;
  if (dataInLen == 0) {
    return true;
  }

  int rv = SZ_BufftoBuffDecompress(out, &outLen, dataIn, dataInLen, szParam_.get());
  if (rv != AEC_OK) {
    return false;
  }

  // Copy from temporary
  buf_.insert(buf_.end(), szTmp_.begin(), szTmp_.begin() + outLen);
  linesDone_++;
  return true;
}